

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::BeginString(VmaJsonWriter *this,char *pStr)

{
  BeginValue(this,false);
  VmaStringBuilder::Add(this->m_SB,'\"');
  this->m_InsideString = true;
  if ((pStr != (char *)0x0) && (*pStr != '\0')) {
    ContinueString(this,pStr);
    return;
  }
  return;
}

Assistant:

void VmaJsonWriter::BeginString(const char* pStr)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(true);
    m_SB.Add('"');
    m_InsideString = true;
    if (pStr != VMA_NULL && pStr[0] != '\0')
    {
        ContinueString(pStr);
    }
}